

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O1

void scaleLp(HighsOptions *options,HighsLp *lp,bool force_scaling)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  bool bVar8;
  HighsInt use_scale_strategy;
  undefined7 in_register_00000011;
  ulong uVar9;
  uint use_scale_strategy_00;
  double original_matrix_max_value;
  double original_matrix_min_value;
  value_type_conflict1 local_48;
  double local_40;
  double local_38;
  
  HighsLp::clearScaling(lp);
  uVar1 = lp->num_col_;
  uVar2 = lp->num_row_;
  uVar3 = (options->super_HighsOptionsStruct).simplex_scale_strategy;
  use_scale_strategy_00 = 3;
  if (uVar3 != 1) {
    use_scale_strategy_00 = uVar3;
  }
  local_38 = INFINITY;
  local_40 = 0.0;
  HighsSparseMatrix::range(&lp->a_matrix_,&local_38,&local_40);
  if ((((int)CONCAT71(in_register_00000011,force_scaling) != 0) || (local_38 < 0.2)) ||
     (5.0 < local_40)) {
    local_48 = 1.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&(lp->scale_).col,(long)(int)uVar1,&local_48);
    local_48 = 1.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&(lp->scale_).row,(long)(int)uVar2,&local_48);
    if ((use_scale_strategy_00 & 0xfffffffe) == 2) {
      bVar8 = equilibrationScaleMatrix(options,lp,use_scale_strategy_00);
    }
    else {
      bVar8 = maxValueScaleMatrix(options,lp,use_scale_strategy);
    }
    if (bVar8 == false) {
      HighsLp::clearScaling(lp);
    }
    else {
      if (0 < (int)uVar1) {
        pdVar4 = (lp->scale_).col.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar5 = (lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6 = (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar7 = (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar9 = 0;
        do {
          pdVar6[uVar9] = pdVar6[uVar9] / pdVar4[uVar9];
          pdVar7[uVar9] = pdVar7[uVar9] / pdVar4[uVar9];
          pdVar5[uVar9] = pdVar4[uVar9] * pdVar5[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar1 != uVar9);
      }
      if (0 < (int)uVar2) {
        pdVar4 = (lp->scale_).row.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar5 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar9 = 0;
        do {
          pdVar5[uVar9] = pdVar4[uVar9] * pdVar5[uVar9];
          pdVar6[uVar9] = pdVar4[uVar9] * pdVar6[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar2 != uVar9);
      }
      (lp->scale_).has_scaling = true;
      (lp->scale_).num_col = uVar1;
      (lp->scale_).num_row = uVar2;
      (lp->scale_).cost = 1.0;
      lp->is_scaled_ = true;
    }
  }
  else if ((options->super_HighsOptionsStruct).highs_analysis_level != 0) {
    highsLogDev(&(options->super_HighsOptionsStruct).log_options,kInfo,
                "Scaling: Matrix has [min, max] values of [%g, %g] within [%g, %g] so no scaling performed\n"
                ,local_38,local_40,0x3fc999999999999a,0x4014000000000000);
  }
  (lp->scale_).strategy = use_scale_strategy_00;
  return;
}

Assistant:

void scaleLp(const HighsOptions& options, HighsLp& lp,
             const bool force_scaling) {
  lp.clearScaling();
  HighsInt numCol = lp.num_col_;
  HighsInt numRow = lp.num_row_;
  // Scaling not well defined for models with no columns
  assert(numCol > 0);
  vector<double>& colCost = lp.col_cost_;
  vector<double>& colLower = lp.col_lower_;
  vector<double>& colUpper = lp.col_upper_;
  vector<double>& rowLower = lp.row_lower_;
  vector<double>& rowUpper = lp.row_upper_;

  // Save the simplex_scale_strategy so that the option can be
  // modified for the course of this method
  HighsInt simplex_scale_strategy = options.simplex_scale_strategy;
  // Determine the actual strategy to use
  HighsInt use_scale_strategy = simplex_scale_strategy;
  if (use_scale_strategy == kSimplexScaleStrategyChoose) {
    // HiGHS is left to choose: currently use forced equilibration, but maybe do
    // something more intelligent
    use_scale_strategy = kSimplexScaleStrategyForcedEquilibration;
  }
  // Find out range of matrix values and skip matrix scaling if all
  // |values| are in [0.2, 5]
  const double no_scaling_original_matrix_min_value = 0.2;
  const double no_scaling_original_matrix_max_value = 5.0;
  double original_matrix_min_value = kHighsInf;
  double original_matrix_max_value = 0;
  lp.a_matrix_.range(original_matrix_min_value, original_matrix_max_value);
  // Possibly force scaling, otherwise base the decision on the range
  // of values in the matrix, values that will be used later for
  // reporting
  const bool no_scaling = force_scaling
                              ? false
                              : (original_matrix_min_value >=
                                 no_scaling_original_matrix_min_value) &&
                                    (original_matrix_max_value <=
                                     no_scaling_original_matrix_max_value);
  bool scaled_matrix = false;
  if (no_scaling) {
    // No matrix scaling, but possible cost scaling
    if (options.highs_analysis_level)
      highsLogDev(options.log_options, HighsLogType::kInfo,
                  "Scaling: Matrix has [min, max] values of [%g, %g] within "
                  "[%g, %g] so no scaling performed\n",
                  original_matrix_min_value, original_matrix_max_value,
                  no_scaling_original_matrix_min_value,
                  no_scaling_original_matrix_max_value);
  } else {
    // Try scaling, so assign unit factors - partly because initial
    // factors may be assumed by the scaling method, but also because
    // scaling factors may not be computed for empty rows/columns
    HighsScale& scale = lp.scale_;
    scale.col.assign(numCol, 1);
    scale.row.assign(numRow, 1);
    const bool equilibration_scaling =
        use_scale_strategy == kSimplexScaleStrategyEquilibration ||
        use_scale_strategy == kSimplexScaleStrategyForcedEquilibration;
    // Try scaling. Value of scaled_matrix indicates whether scaling
    // was considered valuable (and performed). If it's not valuable
    // then the matrix remains unscaled
    if (equilibration_scaling) {
      scaled_matrix = equilibrationScaleMatrix(options, lp, use_scale_strategy);
    } else {
      scaled_matrix = maxValueScaleMatrix(options, lp, use_scale_strategy);
    }
    if (scaled_matrix) {
      // Matrix is scaled, so scale the bounds and costs
      for (HighsInt iCol = 0; iCol < numCol; iCol++) {
        colLower[iCol] /= scale.col[iCol];
        colUpper[iCol] /= scale.col[iCol];
        colCost[iCol] *= scale.col[iCol];
      }
      for (HighsInt iRow = 0; iRow < numRow; iRow++) {
        rowLower[iRow] *= scale.row[iRow];
        rowUpper[iRow] *= scale.row[iRow];
      }
      scale.has_scaling = true;
      scale.num_col = numCol;
      scale.num_row = numRow;
      scale.cost = 1.0;
      lp.is_scaled_ = true;
    } else {
      // Matrix is not scaled, so clear the scaling
      lp.clearScaling();
    }
  }
  // Record the scaling strategy used
  lp.scale_.strategy = use_scale_strategy;
  // Possibly scale the costs
  //  if (allow_cost_scaling) scaleSimplexCost(options, lp, scale.cost);

  // If matrix is unscaled, then LP is only scaled if there is a cost scaling
  // factor
  //  if (!scaled_matrix) lp.is_scaled_ = scale.cost != 1;
}